

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

bool __thiscall VCCluster::removeUnconnected(VCCluster *this,VCCluster *cNull)

{
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *this_00;
  pointer ppsVar1;
  pointer ppsVar2;
  ulong uVar3;
  pointer ppsVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  iterator __begin1;
  pointer ppsVar7;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *__range3;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *this_01;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  components;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *comp;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> unvisited;
  
  components.
  super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  components.
  super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  components.
  super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::_Rb_tree(&unvisited._M_t,&(this->items)._M_t);
  while (ppsVar1 = components.
                   super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        unvisited._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    comp = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)operator_new(0x30);
    p_Var6 = &(comp->_M_t)._M_impl.super__Rb_tree_header;
    (comp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (comp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(comp->_M_t)._M_impl = 0;
    *(undefined8 *)&(comp->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (comp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
    (comp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
    (comp->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    bfs(this,*(VCFace **)(unvisited._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),comp,
        &unvisited);
    std::
    vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
    ::push_back(&components,&comp);
  }
  uVar3 = (long)components.
                super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)components.
                super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < 9) {
    if (uVar3 != 8) goto LAB_00147f77;
    this_01 = &(*components.
                 super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  }
  else {
    ppsVar2 = components.
              super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppsVar4 = components.
              super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppsVar7 = components.
              super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (components.
        super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        components.
        super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      while (ppsVar4 = ppsVar2, ppsVar7 = ppsVar7 + 1,
            ppsVar7 !=
            components.
            super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        ppsVar2 = ppsVar7;
        if (((*ppsVar7)->_M_t)._M_impl.super__Rb_tree_header._M_node_count <=
            ((*ppsVar4)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
          ppsVar2 = ppsVar4;
        }
      }
    }
    this_01 = &(*ppsVar4)->_M_t;
    for (ppsVar7 = components.
                   super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppsVar7 != ppsVar1;
        ppsVar7 = ppsVar7 + 1) {
      this_00 = &(*ppsVar7)->_M_t;
      if (this_00 != this_01) {
        for (p_Var5 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(this_00->_M_impl).super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          giveItem(this,*(VCFace **)(p_Var5 + 1),cNull);
        }
        std::
        _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
        ::~_Rb_tree(this_00);
        operator_delete(this_00);
      }
    }
  }
  if (this_01 !=
      (_Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
       *)0x0) {
    std::
    _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
    ::~_Rb_tree(this_01);
  }
  operator_delete(this_01);
LAB_00147f77:
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&unvisited._M_t);
  std::
  _Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  ::~_Vector_base(&components.
                   super__Vector_base<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
                 );
  return 8 < uVar3;
}

Assistant:

bool VCCluster::removeUnconnected(VCCluster* cNull) {
	vector< set<VCFace*> * > components;
	set<VCFace*> unvisited(items);
	while (!unvisited.empty()) {
		set<VCFace*>* comp = new set<VCFace*>();
		bfs(*unvisited.begin(), comp, &unvisited);
		components.push_back(comp);
	}
	if (components.size() <= 1) {
		if(components.size() == 1)
			delete components[0];
		return false;
	}
	set<VCFace*>* largest = *max_element(components.begin(), components.end(),
		[](set<VCFace*> * s1, set<VCFace*> * s2) -> bool { return s1->size() < s2->size(); });
	for (set<VCFace*>* s : components) {
		if (s != largest) {
			for (VCFace* item : *s) {
				giveItem(item, cNull);
			}
			delete s;
		}
	}
	delete largest;
	return true;
}